

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O2

bool __thiscall ON_NurbsSurface::SetDomain(ON_NurbsSurface *this,int dir,double t0,double t1)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  double *pdVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  
  iVar4 = this->m_order[dir];
  if ((((long)iVar4 < 2) || (this->m_cv_count[dir] < iVar4)) ||
     (pdVar5 = this->m_knot[dir], t1 <= t0 || pdVar5 == (double *)0x0)) {
    uVar8 = 0;
  }
  else {
    dVar1 = pdVar5[(long)iVar4 + -2];
    dVar2 = pdVar5[(ulong)(uint)this->m_cv_count[dir] - 1];
    uVar8 = 1;
    if ((dVar1 == t0) && (!NAN(dVar1) && !NAN(t0))) {
      if ((dVar2 == t1) && (!NAN(dVar2) && !NAN(t1))) goto LAB_00554924;
    }
    uVar8 = 0;
    if (dVar1 < dVar2) {
      dVar10 = (dVar1 + dVar2) * 0.5;
      uVar6 = KnotCount(this,dir);
      uVar7 = (ulong)uVar6;
      if ((int)uVar6 < 1) {
        uVar7 = uVar8;
      }
      for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
        dVar3 = this->m_knot[dir][uVar8];
        dVar11 = t1;
        if (dVar3 <= dVar10) {
          dVar11 = t0;
        }
        uVar9 = -(ulong)(dVar10 < dVar3);
        this->m_knot[dir][uVar8] =
             (dVar3 - (double)(~uVar9 & (ulong)dVar1 | uVar9 & (ulong)dVar2)) *
             ((t1 - t0) / (dVar2 - dVar1)) + dVar11;
      }
      ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
      uVar8 = 1;
    }
  }
LAB_00554924:
  return SUB81(uVar8,0);
}

Assistant:

bool ON_NurbsSurface::SetDomain( 
            int dir, // 0 sets first parameter's domain, 1 gets second parameter's domain
            double t0, 
            double t1
            )
{
  bool rc = false;
  if ( m_order[dir] >= 2 && m_cv_count[dir] >= m_order[dir] && nullptr != m_knot[dir] && t0 < t1 ) {
    const double k0 = m_knot[dir][m_order[dir]-2];
    const double k1 = m_knot[dir][m_cv_count[dir]-1];
    if ( k0 == t0 && k1 == t1 )
      rc = true;
    else if ( k0 < k1 ) {
      const double d = (t1-t0)/(k1-k0);
      const double km = 0.5*(k0+k1);
      const int knot_count = KnotCount(dir);
      int i;
      for ( i = 0; i < knot_count; i++ ) {
        if ( m_knot[dir][i] <= km ) {
          m_knot[dir][i] = (m_knot[dir][i] - k0)*d + t0;
        }
        else {
          m_knot[dir][i] = (m_knot[dir][i] - k1)*d + t1;
        }
      }
			rc = true;
      DestroySurfaceTree();
    }
  }
  return rc;

}